

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

base_learner * nn_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint64_t uVar2;
  undefined8 uVar3;
  nn *pnVar4;
  options_i *options_00;
  int iVar5;
  option_group_definition *poVar6;
  loss_function *plVar7;
  float *pfVar8;
  bool *pbVar9;
  polyprediction *ppVar10;
  base_learner *l;
  single_learner *base;
  learner<nn,_example> *plVar11;
  char *pcVar12;
  bool meanfield;
  free_ptr<nn> n;
  option_group_definition new_options;
  bool local_841;
  code *local_840;
  nn *local_838;
  options_i *local_830;
  string local_828;
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string local_7c8;
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  string local_788;
  undefined1 *local_768;
  long local_760;
  undefined1 local_758 [16];
  option_group_definition local_748;
  string local_710;
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  undefined1 *local_6d0 [2];
  undefined1 local_6c0 [16];
  string local_6b0;
  undefined1 *local_690 [2];
  undefined1 local_680 [16];
  undefined1 local_670 [112];
  bool local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [112];
  bool local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_int> local_d0;
  
  scoped_calloc_or_throw<nn>();
  local_841 = false;
  local_768 = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"Neural Network","");
  local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_748,local_768,local_768 + local_760);
  local_748.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_748.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_748.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"nn","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_670,&local_788,&local_838->k);
  local_600 = true;
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,"Sigmoidal feedforward network with <k> hidden units","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_670);
  poVar6 = VW::config::option_group_definition::add<unsigned_int>(&local_748,&local_d0);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"inpass","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_7c8,&local_838->inpass);
  local_420 = true;
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,
             "Train or test sigmoidal feedforward network with input passthrough.","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_490);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_170);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"multitask","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_808,&local_838->multitask);
  local_4c0 = true;
  local_690[0] = local_680;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_690,"Share hidden layer across all reduced tasks.","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_530);
  local_830 = options;
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_210);
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"dropout","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_6b0,&local_838->dropout);
  local_560 = true;
  local_6d0[0] = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6d0,"Train or test sigmoidal feedforward network using dropout.","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_5d0);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_2b0);
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"meanfield","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_828,&local_841);
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6f0,"Train or test sigmoidal feedforward network using mean field.","")
  ;
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_3f0);
  VW::config::option_group_definition::add<bool>(poVar6,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cafb0;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002cafb0;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  options_00 = local_830;
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_690[0] != local_680) {
    operator_delete(local_690[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002cafb0;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002cafb0;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0c0;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0]);
  }
  local_670._0_8_ = &PTR__typed_option_002cb0c0;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_748);
  pp_Var1 = (_func_int **)(local_670 + 0x10);
  local_670._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"nn","");
  iVar5 = (*options_00->_vptr_options_i[1])(options_00,local_670);
  if ((_func_int **)local_670._0_8_ != pp_Var1) {
    operator_delete((void *)local_670._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar11 = (learner<nn,_example> *)0x0;
  }
  else {
    local_838->all = all;
    if ((local_838->multitask == true) && (all->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using multitask sharing for neural network ",0x2b);
      pcVar12 = "testing";
      if ((ulong)all->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    local_670._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"meanfield","");
    iVar5 = (*options_00->_vptr_options_i[1])(options_00,local_670);
    if ((_func_int **)local_670._0_8_ != pp_Var1) {
      operator_delete((void *)local_670._0_8_);
    }
    if (((char)iVar5 != '\0') && (local_838->dropout = false, all->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using mean field for neural network ",0x24);
      pcVar12 = "testing";
      if ((ulong)all->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    if ((local_838->dropout == true) && (all->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using dropout for neural network ",0x21);
      pcVar12 = "testing";
      if ((ulong)all->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    if ((local_838->inpass == true) && (all->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"using input passthrough for neural network ",0x2b);
      pcVar12 = "testing";
      if ((ulong)all->training != 0) {
        pcVar12 = "training";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,pcVar12,(ulong)all->training + 7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    local_838->finished_setup = false;
    local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"squared","");
    plVar7 = getLossFunction(all,&local_710,0.0);
    local_838->squared_loss = plVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._M_dataplus._M_p != &local_710.field_2) {
      operator_delete(local_710._M_dataplus._M_p);
    }
    uVar2 = all->random_seed;
    local_838->xsubi = uVar2;
    local_838->save_xsubi = uVar2;
    pfVar8 = calloc_or_throw<float>((ulong)local_838->k);
    local_838->hidden_units = pfVar8;
    pbVar9 = calloc_or_throw<bool>((ulong)local_838->k);
    local_838->dropped_out = pbVar9;
    ppVar10 = calloc_or_throw<polyprediction>((ulong)local_838->k);
    local_838->hidden_units_pred = ppVar10;
    ppVar10 = calloc_or_throw<polyprediction>((ulong)local_838->k);
    local_838->hiddenbias_pred = ppVar10;
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    pnVar4 = local_838;
    local_838->increment = *(size_t *)(base + 0xe0);
    plVar11 = LEARNER::learner<nn,example>::init_learner<LEARNER::learner<char,example>>
                        (local_838,base,predict_or_learn_multi<true,true>,
                         predict_or_learn_multi<false,true>,(ulong)(local_838->k + 1),
                         *(prediction_type_t *)(base + 0xd0));
    local_838 = (nn *)0x0;
    if (pnVar4->multitask == true) {
      *(code **)(plVar11 + 0x40) = multipredict;
    }
    uVar3 = *(undefined8 *)(plVar11 + 0x18);
    *(undefined8 *)(plVar11 + 0xb8) = uVar3;
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
    *(undefined8 *)(plVar11 + 0x58) = uVar3;
    *(code **)(plVar11 + 0x68) = finish_example;
    *(undefined8 *)(plVar11 + 0x88) = uVar3;
    *(undefined8 *)(plVar11 + 0x90) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 0x98) = end_pass;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_748.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p);
  }
  if (local_838 != (nn *)0x0) {
    (*local_840)();
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}